

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Expression * __thiscall
soul::StructuralParser::parseExpression(StructuralParser *this,bool allowAssignment)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  Assignment *lhs;
  Expression *pEVar3;
  Op opType;
  Context context;
  CompileMessage local_58;
  
  lhs = (Assignment *)parseTernaryOperator(this);
  __s1 = (this->super_SOULTokeniser).currentType.text;
  if (__s1 == "+=") {
LAB_001f752a:
    opType = add;
    goto LAB_001f7611;
  }
  if (__s1 != (char *)0x0) {
    iVar2 = strcmp(__s1,"+=");
    if (iVar2 == 0) goto LAB_001f752a;
  }
  if (__s1 == "-=") {
LAB_001f753b:
    opType = subtract;
    goto LAB_001f7611;
  }
  if (__s1 != (char *)0x0) {
    iVar2 = strcmp(__s1,"-=");
    if (iVar2 == 0) goto LAB_001f753b;
  }
  if (__s1 == "*=") {
LAB_001f754f:
    opType = multiply;
    goto LAB_001f7611;
  }
  if (__s1 != (char *)0x0) {
    iVar2 = strcmp(__s1,"*=");
    if (iVar2 == 0) goto LAB_001f754f;
  }
  if (__s1 == "/=") {
LAB_001f7563:
    opType = divide;
    goto LAB_001f7611;
  }
  if (__s1 != (char *)0x0) {
    iVar2 = strcmp(__s1,"/=");
    if (iVar2 == 0) goto LAB_001f7563;
  }
  if (__s1 == "%=") {
LAB_001f7577:
    opType = modulo;
    goto LAB_001f7611;
  }
  if (__s1 != (char *)0x0) {
    iVar2 = strcmp(__s1,"%=");
    if (iVar2 == 0) goto LAB_001f7577;
  }
  if (__s1 == "<<=") {
LAB_001f758b:
    opType = leftShift;
    goto LAB_001f7611;
  }
  if (__s1 != (char *)0x0) {
    iVar2 = strcmp(__s1,"<<=");
    if (iVar2 == 0) goto LAB_001f758b;
  }
  if (__s1 == ">>=") {
LAB_001f759c:
    opType = rightShift;
    goto LAB_001f7611;
  }
  if (__s1 != (char *)0x0) {
    iVar2 = strcmp(__s1,">>=");
    if (iVar2 == 0) goto LAB_001f759c;
  }
  if (__s1 == ">>>=") {
LAB_001f75ad:
    opType = rightShiftUnsigned;
    goto LAB_001f7611;
  }
  if (__s1 != (char *)0x0) {
    iVar2 = strcmp(__s1,">>>=");
    if (iVar2 == 0) goto LAB_001f75ad;
  }
  if (__s1 == "^=") {
LAB_001f75be:
    opType = bitwiseXor;
    goto LAB_001f7611;
  }
  if (__s1 != (char *)0x0) {
    iVar2 = strcmp(__s1,"^=");
    if (iVar2 == 0) goto LAB_001f75be;
  }
  if (__s1 == "&=") {
LAB_001f75cf:
    opType = bitwiseAnd;
    goto LAB_001f7611;
  }
  if (__s1 != (char *)0x0) {
    iVar2 = strcmp(__s1,"&=");
    if (iVar2 == 0) goto LAB_001f75cf;
  }
  if (__s1 == "|=") {
LAB_001f75e0:
    opType = bitwiseOr;
    goto LAB_001f7611;
  }
  if (__s1 != (char *)0x0) {
    iVar2 = strcmp(__s1,"|=");
    if (iVar2 == 0) goto LAB_001f75e0;
  }
  if (__s1 == "&&=") {
LAB_001f75f1:
    opType = logicalAnd;
  }
  else {
    if (__s1 != (char *)0x0) {
      iVar2 = strcmp(__s1,"&&=");
      if (iVar2 == 0) goto LAB_001f75f1;
    }
    if (__s1 != "||=") {
      if (__s1 == (char *)0x0) {
LAB_001f748b:
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x289d51);
        if (bVar1) {
          if (!allowAssignment) {
            CompileMessageHelpers::createMessage<>
                      (&local_58,syntax,error,"Assignment is not allowed inside an expression");
            (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this);
            CompileMessage::~CompileMessage(&local_58);
          }
          local_58.description._M_dataplus._M_p =
               (pointer)(this->super_SOULTokeniser).location.sourceCode.object;
          if ((SourceCodeText *)local_58.description._M_dataplus._M_p != (SourceCodeText *)0x0) {
            (((SourceCodeText *)local_58.description._M_dataplus._M_p)->super_RefCountedObject).
            refCount = (((SourceCodeText *)local_58.description._M_dataplus._M_p)->
                       super_RefCountedObject).refCount + 1;
          }
          local_58.description._M_string_length =
               (size_type)(this->super_SOULTokeniser).location.location.data;
          local_58.description.field_2._M_allocated_capacity = (size_type)this->currentScope;
          pEVar3 = parseExpression(this,false);
          lhs = PoolAllocator::
                allocate<soul::AST::Assignment,soul::AST::Context&,soul::AST::Expression&,soul::AST::Expression&>
                          (&this->allocator->pool,(Context *)&local_58,(Expression *)lhs,pEVar3);
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull
                    ((SourceCodeText *)local_58.description._M_dataplus._M_p);
        }
        return &lhs->super_Expression;
      }
      iVar2 = strcmp(__s1,"||=");
      if (iVar2 != 0) goto LAB_001f748b;
    }
    opType = logicalOr;
  }
LAB_001f7611:
  pEVar3 = parseInPlaceOpExpression(this,allowAssignment,(Expression *)lhs,opType);
  return pEVar3;
}

Assistant:

AST::Expression& parseExpression (bool allowAssignment = false)
    {
        auto& lhs = parseTernaryOperator();

        if (matches (Operator::plusEquals))                 return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::add);
        if (matches (Operator::minusEquals))                return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::subtract);
        if (matches (Operator::timesEquals))                return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::multiply);
        if (matches (Operator::divideEquals))               return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::divide);
        if (matches (Operator::moduloEquals))               return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::modulo);
        if (matches (Operator::leftShiftEquals))            return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::leftShift);
        if (matches (Operator::rightShiftEquals))           return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::rightShift);
        if (matches (Operator::rightShiftUnsignedEquals))   return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::rightShiftUnsigned);
        if (matches (Operator::xorEquals))                  return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::bitwiseXor);
        if (matches (Operator::bitwiseAndEquals))           return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::bitwiseAnd);
        if (matches (Operator::bitwiseOrEquals))            return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::bitwiseOr);
        if (matches (Operator::logicalAndEquals))           return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::logicalAnd);
        if (matches (Operator::logicalOrEquals))            return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::logicalOr);

        if (matchIf (Operator::assign))
        {
            if (! allowAssignment)
                throwError (Errors::assignmentInsideExpression());

            auto context = getContext();
            return allocate<AST::Assignment> (context, lhs, parseExpression());
        }

        return lhs;
    }